

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  Path *params_1;
  StringPtr pathText;
  undefined1 auVar3 [16];
  String *pSVar4;
  size_t sVar5;
  ReadableFile *pRVar6;
  undefined1 auVar7 [8];
  undefined8 uVar8;
  undefined8 uVar9;
  size_t in_RCX;
  DiskSchemaFile *extraout_RDX_00;
  DiskSchemaFile *pDVar10;
  DiskSchemaFile *extraout_RDX_01;
  anon_class_24_3_14160855 *func;
  DiskSchemaFile *extraout_RDX_02;
  DiskSchemaFile *extraout_RDX_03;
  DiskSchemaFile *extraout_RDX_04;
  DiskSchemaFile *extraout_RDX_05;
  DiskSchemaFile *extraout_RDX_06;
  long lVar11;
  ReadableDirectory *pRVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> OVar15;
  Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> MVar16;
  StringPtr path;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile384;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile403;
  Path parsed;
  ReadableDirectory *local_250;
  Path local_248;
  DiskSchemaFile *local_230;
  String *local_228;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_220;
  char **local_210;
  undefined1 local_208 [8];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_200;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined8 uStack_1e0;
  char *local_1d8;
  size_t local_1d0;
  Maybe<kj::Exception> local_1c8;
  DiskSchemaFile *extraout_RDX;
  
  local_1d8 = (char *)target.content.size_;
  pRVar12 = (ReadableDirectory *)target.content.ptr;
  if ((in_RCX == 1) || (*local_1d8 != '/')) {
    _local_208 = *(ArrayPtr<const_kj::String> *)(pRVar12 + 2);
    local_1d0 = in_RCX;
    _local_208 = (ArrayPtr<const_kj::String>)kj::PathPtr::parent((PathPtr *)local_208);
    pathText.content.size_ = local_1d0;
    pathText.content.ptr = local_1d8;
    kj::PathPtr::eval(&local_248,(PathPtr *)local_208,pathText);
    auVar3[0xf] = 0;
    auVar3._0_15_ = stack0xfffffffffffffdf9;
    _local_208 = (ArrayPtr<const_kj::String>)(auVar3 << 8);
    if (*(char *)&pRVar12[0xc].super_FsNode._vptr_FsNode == '\x01') {
      local_210 = &local_1d8;
      local_220.disposer = (Disposer *)local_208;
      local_220.ptr = (ReadableFile *)pRVar12;
      kj::
      runCatchingExceptions<capnp::SchemaFile::DiskSchemaFile::import(kj::StringPtr)const::_lambda()_1_>
                (&local_1c8,(kj *)&local_220,func);
      if (local_1c8.ptr.isSet == true) {
        kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
      }
    }
    pp_Var1 = pRVar12[1].super_FsNode._vptr_FsNode;
    (**(code **)(*pp_Var1 + 0x50))(&local_1e8,pp_Var1,local_248.parts.ptr,local_248.parts.size_);
    local_220.disposer = (Disposer *)CONCAT44(uStack_1e4,local_1e8);
    local_220.ptr = uStack_1e0;
    if (uStack_1e0 == (ReadableFile *)0x0) {
      local_1e8 = 0;
      uStack_1e4 = 0;
      uVar13 = 0;
      uVar14 = 0;
      pDVar10 = extraout_RDX_02;
    }
    else {
      OVar15 = kj::
               heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
                         ((kj *)&local_1e8,(ReadableDirectory *)pRVar12[1].super_FsNode._vptr_FsNode
                          ,&local_248,(ArrayPtr<const_kj::ReadableDirectory_*const> *)(pRVar12 + 5),
                          &local_220,(Maybe<kj::String> *)local_208);
      pDVar10 = OVar15.ptr;
      uVar13 = (undefined4)uStack_1e0;
      uVar14 = uStack_1e0._4_4_;
      uStack_1e0 = (ReadableFile *)0x0;
    }
    pRVar6 = local_220.ptr;
    *(undefined4 *)&(this->super_SchemaFile)._vptr_SchemaFile = local_1e8;
    *(undefined4 *)((long)&(this->super_SchemaFile)._vptr_SchemaFile + 4) = uStack_1e4;
    *(undefined4 *)&this->baseDir = uVar13;
    *(undefined4 *)((long)&this->baseDir + 4) = uVar14;
    if (local_220.ptr != (ReadableFile *)0x0) {
      local_220.ptr = (ReadableFile *)0x0;
      (**(local_220.disposer)->_vptr_Disposer)
                (local_220.disposer,
                 (pRVar6->super_FsNode)._vptr_FsNode[-2] +
                 (long)&(pRVar6->super_FsNode)._vptr_FsNode);
      pDVar10 = extraout_RDX_03;
    }
    uVar9 = aStack_200.value.content.size_;
    if ((local_208[0] == true) &&
       (uVar8 = aStack_200.value.content.ptr, aStack_200.value.content.ptr != (char *)0x0)) {
      aStack_200.value.content.ptr = (char *)0;
      aStack_200.value.content.size_ = 0;
      (**(aStack_200.value.content.disposer)->_vptr_ArrayDisposer)
                (aStack_200.value.content.disposer,uVar8,1,uVar9,uVar9,0);
      pDVar10 = extraout_RDX_04;
    }
    sVar5 = local_248.parts.size_;
    pSVar4 = local_248.parts.ptr;
    if (local_248.parts.ptr != (String *)0x0) {
      local_248.parts.ptr = (String *)0x0;
      local_248.parts.size_ = 0;
      (**(local_248.parts.disposer)->_vptr_ArrayDisposer)
                (local_248.parts.disposer,pSVar4,0x18,sVar5,sVar5,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      pDVar10 = extraout_RDX_05;
    }
  }
  else {
    path.content.size_ = (char *)(in_RCX - 1);
    path.content.ptr = path.content.size_;
    kj::Path::parse((Path *)local_208,(Path *)(local_1d8 + 1),path);
    pp_Var1 = pRVar12[6].super_FsNode._vptr_FsNode;
    pDVar10 = extraout_RDX;
    if (pp_Var1 != (_func_int **)0x0) {
      pp_Var2 = pRVar12[5].super_FsNode._vptr_FsNode;
      local_228 = (String *)(this->super_SchemaFile)._vptr_SchemaFile;
      local_250 = this->baseDir;
      lVar11 = 0;
      local_230 = this;
      do {
        params_1 = *(Path **)((long)pp_Var2 + lVar11);
        (*(code *)(params_1->parts).ptr[3].content.size_)
                  (&local_220,params_1,local_208,aStack_200.value.content.ptr);
        pRVar6 = local_220.ptr;
        local_248.parts.ptr = (String *)local_220.disposer;
        local_248.parts.size_ = (size_t)local_220.ptr;
        pDVar10 = extraout_RDX_00;
        if (local_220.ptr != (ReadableFile *)0x0) {
          OVar15 = kj::
                   heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::None_const&>
                             ((ReadableDirectory *)&local_220,params_1,
                              (ArrayPtr<const_kj::ReadableDirectory_*const> *)local_208,
                              (Own<const_kj::ReadableFile,_std::nullptr_t> *)(pRVar12 + 5),
                              (None *)&local_248);
          pDVar10 = OVar15.ptr;
          local_228 = (String *)local_220.disposer;
          local_250 = (ReadableDirectory *)local_220.ptr;
        }
        sVar5 = local_248.parts.size_;
        if ((ReadableDirectory *)local_248.parts.size_ != (ReadableDirectory *)0x0) {
          local_248.parts.size_ = 0;
          (*(code *)(((String *)((local_248.parts.ptr)->content).ptr)->content).ptr)
                    (local_248.parts.ptr,((FsNode *)sVar5)->_vptr_FsNode[-2] + (long)(FsNode *)sVar5
                    );
          pDVar10 = extraout_RDX_01;
        }
        this = local_230;
        if (pRVar6 != (ReadableFile *)0x0) {
          local_230->baseDir = local_250;
          (local_230->super_SchemaFile)._vptr_SchemaFile = (_func_int **)local_228;
          goto LAB_003bd82d;
        }
        lVar11 = lVar11 + 8;
      } while ((long)pp_Var1 << 3 != lVar11);
      local_230->baseDir = local_250;
    }
    (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
    this->baseDir = (ReadableDirectory *)0x0;
LAB_003bd82d:
    auVar7 = local_208;
    if (local_208 != (undefined1  [8])0x0) {
      uVar9 = aStack_200.value.content.ptr;
      _local_208 = (ArrayPtr<const_kj::String>)ZEXT816(0);
      (***(_func_int ***)aStack_200.value.content.size_)
                (aStack_200.value.content.size_,auVar7,0x18,uVar9,uVar9,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      pDVar10 = extraout_RDX_06;
    }
  }
  MVar16.ptr.ptr = &pDVar10->super_SchemaFile;
  MVar16.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>)MVar16.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_SOME(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(newFile), kj::none));
        }
      }
      return kj::none;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_SOME(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(newFile), kj::mv(displayNameOverride)));
      } else {
        return kj::none;
      }
    }